

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFParser::parse(QPDFParser *this,InputSource *input,string *object_description,
                 QPDFTokenizer *tokenizer,bool *empty,StringDecrypter *decrypter,QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  undefined1 local_e8 [16];
  QPDFParser local_d8;
  
  iVar1 = (*input->_vptr_InputSource[3])(input);
  make_description((QPDFParser *)local_e8,(string *)CONCAT44(extraout_var,iVar1),object_description)
  ;
  local_d8.tokenizer =
       (tokenizer->m)._M_t.
       super___uniq_ptr_impl<qpdf::Tokenizer,_std::default_delete<qpdf::Tokenizer>_>._M_t.
       super__Tuple_impl<0UL,_qpdf::Tokenizer_*,_std::default_delete<qpdf::Tokenizer>_>.
       super__Head_base<0UL,_qpdf::Tokenizer_*,_false>._M_head_impl;
  local_d8.context = context;
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_e8._0_8_;
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  local_d8.parse_pdf = false;
  local_d8._60_8_ = 0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (StackFrame *)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.frame = (StackFrame *)0x0;
  local_d8.bad_count = 0;
  local_d8._108_8_ = 0xf;
  local_d8.start = 0;
  local_d8.int_count = 0;
  local_e8._0_8_ = (InputSource *)0x0;
  local_e8._8_8_ = (string *)0x0;
  local_d8.int_buffer[0] = 0;
  local_d8.int_buffer[1] = 0;
  local_d8.last_offset_buffer[0] = 0;
  local_d8.last_offset_buffer[1] = 0;
  local_d8.input = input;
  local_d8.object_description = object_description;
  local_d8.decrypter = decrypter;
  parse(this,(bool *)(local_e8 + 0x10),SUB81(empty,0));
  ~QPDFParser((QPDFParser *)(local_e8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(
    InputSource& input,
    std::string const& object_description,
    QPDFTokenizer& tokenizer,
    bool& empty,
    QPDFObjectHandle::StringDecrypter* decrypter,
    QPDF* context)
{
    return QPDFParser(
               input,
               make_description(input.getName(), object_description),
               object_description,
               *tokenizer.m,
               decrypter,
               context,
               false)
        .parse(empty, false);
}